

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O2

bool __thiscall
draco::RAnsSymbolEncoder<6>::ProbabilityLess::operator()(ProbabilityLess *this,int i,int j)

{
  uint uVar1;
  const_reference pvVar2;
  
  pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::at
                     (this->probabilities,(long)i);
  uVar1 = pvVar2->prob;
  pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::at
                     (this->probabilities,(long)j);
  return uVar1 < pvVar2->prob;
}

Assistant:

bool operator()(int i, int j) const {
      return probabilities->at(i).prob < probabilities->at(j).prob;
    }